

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *fields,
               FlatAllocator *alloc)

{
  bool bVar1;
  int array_size;
  FieldDescriptorProto_Type FVar2;
  reference this;
  string *name;
  string *local_58;
  FieldDescriptorProto *field;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range2;
  FlatAllocator *alloc_local;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *fields_local;
  
  array_size = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::size(fields);
  anon_unknown_23::
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::PlanArray<google::protobuf::FieldDescriptor>
            (&alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ,array_size);
  __end2 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(fields);
  field = (FieldDescriptorProto *)
          RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(fields);
  while (bVar1 = internal::operator!=(&__end2,(iterator *)&field), bVar1) {
    this = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator*
                     (&__end2);
    bVar1 = FieldDescriptorProto::has_options(this);
    if (bVar1) {
      anon_unknown_23::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<google::protobuf::FieldOptions>
                (&alloc->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ,1);
    }
    name = FieldDescriptorProto::name_abi_cxx11_(this);
    bVar1 = FieldDescriptorProto::has_json_name(this);
    if (bVar1) {
      local_58 = FieldDescriptorProto::json_name_abi_cxx11_(this);
    }
    else {
      local_58 = (string *)0x0;
    }
    anon_unknown_23::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanFieldNames(&alloc->
                      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                     ,name,local_58);
    bVar1 = FieldDescriptorProto::has_default_value(this);
    if (((bVar1) && (bVar1 = FieldDescriptorProto::has_type(this), bVar1)) &&
       ((FVar2 = FieldDescriptorProto::type(this), FVar2 == FieldDescriptorProto_Type_TYPE_STRING ||
        (FVar2 = FieldDescriptorProto::type(this), FVar2 == FieldDescriptorProto_Type_TYPE_BYTES))))
    {
      (anonymous_namespace)::
      FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
      ::PlanArray<std::__cxx11::string>
                ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  *)alloc,1);
    }
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++(&__end2)
    ;
  }
  return;
}

Assistant:

static void PlanAllocationSize(
    const RepeatedPtrField<FieldDescriptorProto>& fields,
    internal::FlatAllocator& alloc) {
  alloc.PlanArray<FieldDescriptor>(fields.size());
  for (const auto& field : fields) {
    if (field.has_options()) alloc.PlanArray<FieldOptions>(1);
    alloc.PlanFieldNames(field.name(),
                         field.has_json_name() ? &field.json_name() : nullptr);
    if (field.has_default_value() && field.has_type() &&
        (field.type() == FieldDescriptorProto::TYPE_STRING ||
         field.type() == FieldDescriptorProto::TYPE_BYTES)) {
      // For the default string value.
      alloc.PlanArray<std::string>(1);
    }
  }
}